

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

bool __thiscall camp::Property::readable(Property *this,UserObject *object)

{
  uint uVar1;
  bool local_19;
  UserObject *object_local;
  Property *this_local;
  
  uVar1 = (*(this->super_TagHolder)._vptr_TagHolder[5])();
  local_19 = false;
  if ((uVar1 & 1) != 0) {
    local_19 = detail::Getter<bool>::get(&this->m_readable,object);
  }
  return local_19;
}

Assistant:

bool Property::readable(const UserObject& object) const
{
    return isReadable() && m_readable.get(object);
}